

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

void __thiscall
pbrt::BVHAggregate::BVHAggregate
          (BVHAggregate *this,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *p,
          int maxPrimsInNode,SplitMethod splitMethod)

{
  undefined8 *puVar1;
  pointer pPVar2;
  pointer pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pPVar6;
  atomic<int> aVar7;
  int iVar8;
  memory_resource *pmVar9;
  BVHBuildNode *node;
  LinearBVHNode *pLVar10;
  long lVar11;
  LinearBVHNode *pLVar12;
  size_t i;
  ulong uVar13;
  long lVar14;
  size_type __n;
  long in_FS_OFFSET;
  bool bVar15;
  ulong uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 in_ZMM2 [64];
  atomic<int> totalNodes;
  __int_type_conflict va;
  atomic<int> orderedPrimsOffset;
  int offset;
  undefined4 uStack_ec;
  _Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_e8;
  SplitMethod local_c4;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> bvhPrimitives;
  vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  threadAllocators;
  vector<pstd::pmr::monotonic_buffer_resource,_std::allocator<pstd::pmr::monotonic_buffer_resource>_>
  threadResources;
  monotonic_buffer_resource resource;
  
  iVar8 = 0xff;
  if (maxPrimsInNode < 0xff) {
    iVar8 = maxPrimsInNode;
  }
  this->maxPrimsInNode = iVar8;
  pPVar2 = (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar2;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->splitMethod = splitMethod;
  this->nodes = (LinearBVHNode *)0x0;
  pPVar2 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar3 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pPVar2 == pPVar3) {
    LogFatal<char_const(&)[20]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
               ,0x92,"Check failed: %s",(char (*) [20])"!primitives.empty()");
  }
  local_c4 = splitMethod;
  std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::vector
            (&bvhPrimitives,(long)pPVar3 - (long)pPVar2 >> 3,(allocator_type *)&resource);
  lVar14 = 0;
  lVar11 = 0;
  uVar13 = 0;
  while( true ) {
    pPVar2 = (this->primitives).
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->primitives).
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3) <= uVar13)
    break;
    in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
    PrimitiveHandle::Bounds
              ((Bounds3f *)&threadResources,
               (PrimitiveHandle *)
               ((long)&(pPVar2->
                       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                       ).bits + lVar14));
    BVHPrimitive::BVHPrimitive((BVHPrimitive *)&resource,uVar13,(Bounds3f *)&threadResources);
    uVar13 = uVar13 + 1;
    lVar14 = lVar14 + 8;
    puVar1 = (undefined8 *)
             ((long)&((bvhPrimitives.
                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>.
                       _M_impl.super__Vector_impl_data._M_start)->bounds).pMin.
                     super_Tuple3<pbrt::Point3,_float>.y + lVar11);
    *puVar1 = CONCAT44((undefined4)resource.blockSize,resource.upstreamResource._4_4_);
    puVar1[1] = CONCAT44(resource.currentBlock.ptr._0_4_,resource.blockSize._4_4_);
    puVar1[2] = CONCAT44((undefined4)resource.currentBlock.size,resource.currentBlock.ptr._4_4_);
    puVar1[3] = CONCAT44((undefined4)resource.currentBlockPos,resource.currentBlock.size._4_4_);
    puVar1 = (undefined8 *)
             ((long)&(bvhPrimitives.
                      super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>.
                      _M_impl.super__Vector_impl_data._M_start)->primitiveIndex + lVar11);
    *puVar1 = resource.super_memory_resource._vptr_memory_resource;
    puVar1[1] = CONCAT44(resource.upstreamResource._4_4_,resource.upstreamResource._0_4_);
    puVar1[2] = CONCAT44(resource.blockSize._4_4_,(undefined4)resource.blockSize);
    puVar1[3] = CONCAT44(resource.currentBlock.ptr._4_4_,resource.currentBlock.ptr._0_4_);
    lVar11 = lVar11 + 0x30;
  }
  auVar17 = ZEXT1664(in_ZMM2._0_16_);
  pmVar9 = pstd::pmr::get_default_resource();
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&resource.usedBlocks;
  resource.super_memory_resource._vptr_memory_resource =
       (_func_int **)&PTR__monotonic_buffer_resource_02eeea08;
  resource.upstreamResource._0_4_ = SUB84(pmVar9,0);
  resource.upstreamResource._4_4_ = (undefined4)((ulong)pmVar9 >> 0x20);
  resource.blockSize._0_4_ = 0x40000;
  resource.blockSize._4_4_ = 0;
  resource.currentBlock.ptr._0_4_ = 0;
  resource.currentBlock.ptr._4_4_ = 0;
  resource.currentBlock.size._0_4_ = 0;
  resource.currentBlock.size._4_4_ = 0;
  resource.currentBlockPos._0_4_ = 0;
  resource.currentBlockPos._4_4_ = 0;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       resource.usedBlocks.
       super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  iVar8 = MaxThreadIndex();
  __n = (size_type)iVar8;
  std::
  vector<pstd::pmr::monotonic_buffer_resource,_std::allocator<pstd::pmr::monotonic_buffer_resource>_>
  ::vector(&threadResources,__n,(allocator_type *)&threadAllocators);
  lVar11 = 0;
  threadAllocators.
  super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threadAllocators.
  super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  threadAllocators.
  super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    auVar24 = auVar17._0_16_;
    bVar15 = __n == 0;
    __n = __n - 1;
    if (bVar15) break;
    local_e8._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&((threadResources.
                            super__Vector_base<pstd::pmr::monotonic_buffer_resource,_std::allocator<pstd::pmr::monotonic_buffer_resource>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_memory_resource).
                          _vptr_memory_resource + lVar11);
    std::
    vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>
    ::emplace_back<pstd::pmr::polymorphic_allocator<std::byte>>
              ((vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>
                *)&threadAllocators,(polymorphic_allocator<std::byte> *)&local_e8);
    lVar11 = lVar11 + 0x48;
  }
  totalNodes.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::vector
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)&local_e8,
             (long)(this->primitives).
                   super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->primitives).
                   super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&offset);
  if (local_c4 == HLBVH) {
    node = buildHLBVH(this,&resource.super_memory_resource,&bvhPrimitives,&totalNodes,
                      (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                      &local_e8);
  }
  else {
    orderedPrimsOffset.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    node = buildRecursive(this,&threadAllocators,&bvhPrimitives,0,
                          (int)((ulong)((long)(this->primitives).
                                              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->primitives).
                                             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),
                          &totalNodes,&orderedPrimsOffset,
                          (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                          &local_e8);
    va = (__int_type_conflict)orderedPrimsOffset.super___atomic_base<int>._M_i;
    _offset = (long)local_e8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_e8._M_impl.super__Vector_impl_data._M_start >> 3;
    if (_offset != (long)(int)orderedPrimsOffset.super___atomic_base<int>._M_i) {
      LogFatal<char_const(&)[26],char_const(&)[20],char_const(&)[26],int&,char_const(&)[20],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0xac,"Check failed: %s == %s with %s = %s, %s = %s",
                 (char (*) [26])"orderedPrimsOffset.load()",(char (*) [20])"orderedPrims.size()",
                 (char (*) [26])"orderedPrimsOffset.load()",&va,(char (*) [20])"orderedPrims.size()"
                 ,(unsigned_long *)&offset);
    }
  }
  pPVar2 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e8._M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar3 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar6 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_start = local_e8._M_impl.super__Vector_impl_data._M_start;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = local_e8._M_impl.super__Vector_impl_data._M_finish;
  local_e8._M_impl.super__Vector_impl_data._M_start = pPVar3;
  local_e8._M_impl.super__Vector_impl_data._M_finish = pPVar6;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar2;
  std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::resize(&bvhPrimitives,0);
  if (LOGGING_LogLevel < 1) {
    _offset = CONCAT44(uStack_ec,totalNodes.super___atomic_base<int>._M_i);
    orderedPrimsOffset.super___atomic_base<int>._M_i =
         SUB84((ulong)((long)(this->primitives).
                             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->primitives).
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3,0);
    auVar24 = vcvtusi2ss_avx512f(auVar24,(long)(int)totalNodes.super___atomic_base<int>._M_i << 5);
    va = (__int_type_conflict)(auVar24._0_4_ * 9.536743e-07);
    Log<int,int,float>(Verbose,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                       ,0xb2,"BVH created with %d nodes for %d primitives (%.2f MB)",&offset,
                       (int *)&orderedPrimsOffset,(float *)&va);
  }
  aVar7.super___atomic_base<int>._M_i = totalNodes.super___atomic_base<int>._M_i;
  *(long *)(in_FS_OFFSET + -0x330) =
       (long)(this->primitives).
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish +
       *(long *)(in_FS_OFFSET + -0x330) +
       ((long)(int)totalNodes.super___atomic_base<int>._M_i * 0x20 -
       (long)(this->primitives).
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_start) + 0x30;
  lVar11 = (long)(int)totalNodes.super___atomic_base<int>._M_i;
  uVar13 = 0xffffffffffffffff;
  if (-1 < (int)totalNodes.super___atomic_base<int>._M_i) {
    uVar13 = lVar11 << 5;
  }
  pLVar10 = (LinearBVHNode *)operator_new__(uVar13,0x20);
  if (aVar7.super___atomic_base<int>._M_i != 0) {
    auVar17 = vbroadcastss_avx512f(ZEXT416(0x7f7fffff));
    auVar18 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar13 = lVar11 + 0x7ffffffffffffff;
    auVar21 = vpbroadcastq_avx512f();
    lVar11 = 0;
    pLVar12 = pLVar10;
    do {
      auVar22 = vpbroadcastq_avx512f();
      lVar11 = lVar11 + 0x10;
      auVar23 = vporq_avx512f(auVar22,auVar19);
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar4 = vpcmpuq_avx512f(auVar22,auVar21,2);
      uVar5 = vpcmpuq_avx512f(auVar23,auVar21,2);
      uVar16 = (ulong)CONCAT11((char)uVar5,(char)uVar4);
      vscatterdps_avx512f(ZEXT864(pLVar12) + _DAT_0053d180,uVar16,auVar17);
      vscatterdps_avx512f(ZEXT864(pLVar12) + ZEXT864(4) + _DAT_0053d180,uVar16,auVar17);
      vscatterdps_avx512f(ZEXT864(pLVar12) + _DAT_0053d1c0,uVar16,auVar17);
      vscatterdps_avx512f(ZEXT864(pLVar12) + _DAT_0053d200,uVar16,auVar18);
      vscatterdps_avx512f(ZEXT864(pLVar12) + _DAT_0053d240,uVar16,auVar18);
      vscatterdps_avx512f(ZEXT864(pLVar12) + _DAT_0053d280,uVar16,auVar18);
      pLVar12 = pLVar12 + 0x10;
    } while (((uVar13 & 0x7ffffffffffffff) + 0x10) - (ulong)((uint)uVar13 & 0xf) != lVar11);
  }
  this->nodes = pLVar10;
  _offset = _offset & 0xffffffff00000000;
  flattenBVHTree(this,node,&offset);
  orderedPrimsOffset = totalNodes;
  va = offset;
  if (totalNodes.super___atomic_base<int>._M_i == (__atomic_base<int>)offset) {
    std::_Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~_Vector_base
              (&local_e8);
    std::
    _Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
    ::~_Vector_base(&threadAllocators.
                     super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
                   );
    std::
    vector<pstd::pmr::monotonic_buffer_resource,_std::allocator<pstd::pmr::monotonic_buffer_resource>_>
    ::~vector(&threadResources);
    pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(&resource);
    std::_Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::~_Vector_base
              (&bvhPrimitives.
                super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>);
    return;
  }
  LogFatal<char_const(&)[18],char_const(&)[7],char_const(&)[18],int&,char_const(&)[7],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
             ,0xba,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [18])"totalNodes.load()"
             ,(char (*) [7])0x9f0e9a,(char (*) [18])"totalNodes.load()",(int *)&orderedPrimsOffset,
             (char (*) [7])0x9f0e9a,&va);
}

Assistant:

BVHAggregate::BVHAggregate(std::vector<PrimitiveHandle> p, int maxPrimsInNode,
                           SplitMethod splitMethod)
    : maxPrimsInNode(std::min(255, maxPrimsInNode)),
      primitives(std::move(p)),
      splitMethod(splitMethod) {
    CHECK(!primitives.empty());
    // Build BVH from _primitives_
    // Initialize _bvhPrimitives_ array for primitives
    std::vector<BVHPrimitive> bvhPrimitives(primitives.size());
    for (size_t i = 0; i < primitives.size(); ++i)
        bvhPrimitives[i] = BVHPrimitive(i, primitives[i].Bounds());

    // Build BVH for primitives using _bvhPrimitives_
    // Declare _Allocator_s used for BVH construction
    pstd::pmr::monotonic_buffer_resource resource;
    Allocator alloc(&resource);
    int nThreads = MaxThreadIndex();
    std::vector<pstd::pmr::monotonic_buffer_resource> threadResources(nThreads);
    std::vector<Allocator> threadAllocators;
    for (size_t i = 0; i < nThreads; ++i)
        threadAllocators.push_back(Allocator(&threadResources[i]));

    std::atomic<int> totalNodes{0};
    std::vector<PrimitiveHandle> orderedPrims(primitives.size());
    BVHBuildNode *root;
    if (splitMethod == SplitMethod::HLBVH) {
        root = buildHLBVH(alloc, bvhPrimitives, &totalNodes, orderedPrims);
    } else {
        std::atomic<int> orderedPrimsOffset{0};
        root = buildRecursive(threadAllocators, bvhPrimitives, 0, primitives.size(),
                              &totalNodes, &orderedPrimsOffset, orderedPrims);
        CHECK_EQ(orderedPrimsOffset.load(), orderedPrims.size());
    }
    primitives.swap(orderedPrims);
    bvhPrimitives.resize(0);
    LOG_VERBOSE("BVH created with %d nodes for %d primitives (%.2f MB)",
                totalNodes.load(), (int)primitives.size(),
                float(totalNodes.load() * sizeof(LinearBVHNode)) / (1024.f * 1024.f));

    // Flatten BVH into _nodes_ array
    treeBytes += totalNodes * sizeof(LinearBVHNode) + sizeof(*this) +
                 primitives.size() * sizeof(primitives[0]);
    nodes = new LinearBVHNode[totalNodes];
    int offset = 0;
    flattenBVHTree(root, &offset);
    CHECK_EQ(totalNodes.load(), offset);
}